

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O3

cio_error cio_buffered_stream_read_at_most
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,size_t num,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  cio_error cVar1;
  
  cVar1 = CIO_INVALID_ARGUMENT;
  if (((buffer != (cio_read_buffer *)0x0) && (buffered_stream != (cio_buffered_stream *)0x0)) &&
     (handler != (cio_buffered_stream_read_handler_t)0x0)) {
    (buffered_stream->read_info).bytes_to_read = num;
    buffered_stream->read_job = internal_read_max;
    buffered_stream->read_buffer = buffer;
    buffered_stream->read_handler = handler;
    buffered_stream->read_handler_context = handler_context;
    buffered_stream->last_error = CIO_SUCCESS;
    cVar1 = CIO_SUCCESS;
    if (buffered_stream->callback_is_running == 0) {
      run_read(buffered_stream);
    }
  }
  return cVar1;
}

Assistant:

enum cio_error cio_buffered_stream_read_at_most(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, size_t num, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	if (cio_unlikely((buffered_stream == NULL) || (handler == NULL) || (buffer == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	buffered_stream->read_info.bytes_to_read = num;
	buffered_stream->read_job = internal_read_max;
	buffered_stream->read_buffer = buffer;
	buffered_stream->read_handler = handler;
	buffered_stream->read_handler_context = handler_context;
	buffered_stream->last_error = CIO_SUCCESS;
	start_read(buffered_stream);

	return CIO_SUCCESS;
}